

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
pdqsort_detail::
partition_right<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedKnapsackCover()::__0>
          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_8_1_8991fb9c comp)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a;
  bool bVar1;
  reference piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var3;
  int *in_RSI;
  int *in_RDI;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pivot_pos;
  bool already_partitioned;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  T pivot;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar5;
  undefined4 in_stack_ffffffffffffff74;
  int iVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff78;
  byte local_79;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  int *local_60;
  int *local_58;
  undefined1 local_49;
  int *local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  int local_2c;
  anon_class_8_1_8991fb9c local_28;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18 [3];
  
  local_20 = in_RSI;
  local_18[0]._M_current = in_RDI;
  piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  local_2c = *piVar2;
  local_38._M_current = local_18[0]._M_current;
  local_40._M_current = local_20;
  do {
    p_Var3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++(&local_38);
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (p_Var3);
    bVar1 = HighsCutGeneration::separateLiftedKnapsackCover::anon_class_8_1_8991fb9c::operator()
                      (&local_28,*piVar2,local_2c);
  } while (bVar1);
  local_48 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator-(in_stack_ffffffffffffff78,
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff68._M_current);
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff68._M_current);
      local_79 = 0;
      if (bVar1) {
        p_Var3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator--(&local_40);
        piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(p_Var3);
        bVar1 = HighsCutGeneration::separateLiftedKnapsackCover::anon_class_8_1_8991fb9c::operator()
                          (&local_28,*piVar2,local_2c);
        local_79 = bVar1 ^ 0xff;
      }
    } while ((local_79 & 1) != 0);
  }
  else {
    do {
      p_Var3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator--(&local_40);
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(p_Var3);
      bVar1 = HighsCutGeneration::separateLiftedKnapsackCover::anon_class_8_1_8991fb9c::operator()
                        (&local_28,*piVar2,local_2c);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_49 = __gnu_cxx::operator>=
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        in_stack_ffffffffffffff68._M_current);
  while (bVar1 = __gnu_cxx::operator<
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffff68._M_current), bVar1) {
    local_58 = local_38._M_current;
    local_60 = local_40._M_current;
    __a._M_current._4_4_ = in_stack_ffffffffffffff74;
    __a._M_current._0_4_ = in_stack_ffffffffffffff70;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (__a,in_stack_ffffffffffffff68);
    do {
      p_Var3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&local_38);
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(p_Var3);
      bVar1 = HighsCutGeneration::separateLiftedKnapsackCover::anon_class_8_1_8991fb9c::operator()
                        (&local_28,*piVar2,local_2c);
    } while (bVar1);
    do {
      p_Var3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator--(&local_40);
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(p_Var3);
      bVar1 = HighsCutGeneration::separateLiftedKnapsackCover::anon_class_8_1_8991fb9c::operator()
                        (&local_28,*piVar2,local_2c);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_68 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                       (in_stack_ffffffffffffff78,
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  p_Var3 = &local_68;
  piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var3);
  iVar5 = *piVar2;
  piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  *piVar2 = iVar5;
  iVar6 = local_2c;
  piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var3);
  *piVar2 = iVar6;
  pVar4 = std::
          make_pair<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>&,bool&>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(iVar6,iVar5),(bool *)in_stack_ffffffffffffff68._M_current);
  return pVar4;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }